

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  EdgeSide EVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  OutRec *outRec1;
  OutRec *outRec2;
  OutPt *pOVar5;
  OutPt *pOVar6;
  OutPt *pOVar7;
  OutPt *pOVar8;
  OutPt *pOVar9;
  OutRec *pOVar10;
  OutRec *pOVar11;
  OutRec *pOVar12;
  _func_int *p_Var13;
  OutPt *pOVar14;
  
  lVar4 = *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]);
  outRec1 = *(OutRec **)(lVar4 + (long)e1->OutIdx * 8);
  outRec2 = *(OutRec **)(lVar4 + (long)e2->OutIdx * 8);
  pOVar11 = outRec1;
  do {
    pOVar11 = pOVar11->FirstLeft;
    if (pOVar11 == outRec2) break;
  } while (pOVar11 != (OutRec *)0x0);
  pOVar10 = outRec2;
  pOVar12 = outRec2;
  if (pOVar11 != outRec2) {
    do {
      pOVar12 = pOVar12->FirstLeft;
      if (pOVar12 == outRec1) break;
    } while (pOVar12 != (OutRec *)0x0);
    pOVar10 = outRec1;
    if (pOVar12 != outRec1) {
      pOVar10 = GetLowermostRec(outRec1,outRec2);
    }
  }
  pOVar5 = outRec1->Pts;
  pOVar6 = pOVar5->Prev;
  pOVar7 = outRec2->Pts;
  pOVar8 = pOVar7->Prev;
  EVar1 = e1->Side;
  if (EVar1 == esLeft) {
    pOVar14 = pOVar7;
    if (e2->Side == esLeft) {
      do {
        pOVar9 = pOVar14->Next;
        pOVar14->Next = pOVar14->Prev;
        pOVar14->Prev = pOVar9;
        pOVar14 = pOVar9;
      } while (pOVar9 != pOVar7);
      pOVar7->Next = pOVar5;
      pOVar5->Prev = pOVar7;
      pOVar6->Next = pOVar8;
      pOVar8->Prev = pOVar6;
      outRec1->Pts = pOVar8;
    }
    else {
      pOVar8->Next = pOVar5;
      pOVar5->Prev = pOVar8;
      pOVar7->Prev = pOVar6;
      pOVar6->Next = pOVar7;
      outRec1->Pts = pOVar7;
    }
  }
  else {
    pOVar14 = pOVar7;
    if (e2->Side == esRight) {
      do {
        pOVar9 = pOVar14->Next;
        pOVar14->Next = pOVar14->Prev;
        pOVar14->Prev = pOVar9;
        pOVar14 = pOVar9;
      } while (pOVar9 != pOVar7);
      pOVar6->Next = pOVar8;
      pOVar8->Prev = pOVar6;
      pOVar7->Next = pOVar5;
      pOVar5->Prev = pOVar7;
    }
    else {
      pOVar6->Next = pOVar7;
      pOVar7->Prev = pOVar6;
      pOVar5->Prev = pOVar8;
      pOVar8->Next = pOVar5;
    }
  }
  outRec1->BottomPt = (OutPt *)0x0;
  if (pOVar10 == outRec2) {
    if (outRec2->FirstLeft != outRec1) {
      outRec1->FirstLeft = outRec2->FirstLeft;
    }
    outRec1->IsHole = outRec2->IsHole;
  }
  outRec2->Pts = (OutPt *)0x0;
  outRec2->BottomPt = (OutPt *)0x0;
  outRec2->FirstLeft = outRec1;
  iVar2 = e1->OutIdx;
  iVar3 = e2->OutIdx;
  e1->OutIdx = -1;
  e2->OutIdx = -1;
  p_Var13 = (_func_int *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  do {
    p_Var13 = *(_func_int **)(p_Var13 + 0x68);
    if (p_Var13 == (_func_int *)0x0) goto LAB_001117df;
  } while (*(int *)(p_Var13 + 0x4c) != iVar3);
  *(int *)(p_Var13 + 0x4c) = iVar2;
  *(EdgeSide *)(p_Var13 + 0x3c) = EVar1;
LAB_001117df:
  outRec2->Idx = outRec1->Idx;
  return;
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->OutIdx];
  OutRec *outRec2 = m_PolyOuts[e2->OutIdx];

  OutRec *holeStateRec;
  if (OutRec1RightOfOutRec2(outRec1, outRec2))
    holeStateRec = outRec2;
  else if (OutRec1RightOfOutRec2(outRec2, outRec1))
    holeStateRec = outRec1;
  else 
    holeStateRec = GetLowermostRec(outRec1, outRec2);

  //get the start and ends of both output polygons and
  //join e2 poly onto e1 poly and delete pointers to e2 ...

  OutPt* p1_lft = outRec1->Pts;
  OutPt* p1_rt = p1_lft->Prev;
  OutPt* p2_lft = outRec2->Pts;
  OutPt* p2_rt = p2_lft->Prev;

  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->Side == esLeft )
  {
    if(  e2->Side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(p2_lft);
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      outRec1->Pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->Next = p1_lft;
      p1_lft->Prev = p2_rt;
      p2_lft->Prev = p1_rt;
      p1_rt->Next = p2_lft;
      outRec1->Pts = p2_lft;
    }
  } else
  {
    if(  e2->Side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks(p2_lft);
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->Next = p2_lft;
      p2_lft->Prev = p1_rt;
      p1_lft->Prev = p2_rt;
      p2_rt->Next = p1_lft;
    }
  }

  outRec1->BottomPt = 0;
  if (holeStateRec == outRec2)
  {
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->IsHole = outRec2->IsHole;
  }
  outRec2->Pts = 0;
  outRec2->BottomPt = 0;
  outRec2->FirstLeft = outRec1;

  int OKIdx = e1->OutIdx;
  int ObsoleteIdx = e2->OutIdx;

  e1->OutIdx = Unassigned; //nb: safe because we only get here via AddLocalMaxPoly
  e2->OutIdx = Unassigned;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->OutIdx == ObsoleteIdx )
    {
      e->OutIdx = OKIdx;
      e->Side = e1->Side;
      break;
    }
    e = e->NextInAEL;
  }

  outRec2->Idx = outRec1->Idx;
}